

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O1

void __thiscall re2c::CpgotoTable::CpgotoTable(CpgotoTable *this,Span *span,uint32_t nSpans)

{
  State **ppSVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  ppSVar1 = (State **)operator_new__(0x800);
  this->table = ppSVar1;
  if (nSpans != 0) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      uVar4 = span[uVar2].ub;
      if (0xff < uVar4) {
        uVar4 = 0x100;
      }
      if ((uint)uVar3 < uVar4) {
        uVar3 = uVar3 & 0xffffffff;
        do {
          this->table[uVar3] = span[uVar2].to;
          uVar3 = uVar3 + 1;
        } while (uVar4 != uVar3);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != nSpans);
  }
  return;
}

Assistant:

CpgotoTable::CpgotoTable (const Span * span, uint32_t nSpans)
	: table (new const State * [TABLE_SIZE])
{
	uint32_t c = 0;
	for (uint32_t i = 0; i < nSpans; ++i)
	{
		for(; c < span[i].ub && c < TABLE_SIZE; ++c)
		{
			table[c] = span[i].to;
		}
	}
}